

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

LockProxy __thiscall CategoriesMutex::try_lock(CategoriesMutex *this,int category)

{
  int iVar1;
  int in_EDX;
  CategoriesMutex *extraout_RDX;
  undefined4 in_register_00000034;
  int *piVar2;
  LockProxy LVar3;
  
  piVar2 = (int *)CONCAT44(in_register_00000034,category);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(piVar2 + 8));
  if (iVar1 == 0) {
    iVar1 = 2;
    if (*piVar2 == -1 || *piVar2 == in_EDX) {
      iVar1 = 1;
      if (piVar2[1] != *(int *)(*(long *)(piVar2 + 2) + (long)in_EDX * 4)) {
        *piVar2 = in_EDX;
        piVar2[1] = piVar2[1] + 1;
        iVar1 = 0;
      }
    }
    this->current_category_ = iVar1;
    (this->category_sizes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = piVar2;
    pthread_mutex_unlock((pthread_mutex_t *)(piVar2 + 8));
    LVar3.mutex_ = extraout_RDX;
    LVar3._0_8_ = this;
    return LVar3;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

LockProxy try_lock(int category) {
        std::lock_guard lock(internal_);
        return LockProxy(*this, try_lock_unsafe(category));
    }